

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day25.cpp
# Opt level: O3

void day25(input_t input)

{
  undefined4 uVar1;
  char cVar2;
  ushort uVar3;
  undefined1 auVar4 [32];
  uint uVar5;
  pointer pSVar6;
  pointer pSVar7;
  Set *pSVar8;
  ulong uVar9;
  pointer pSVar10;
  uint16_t uVar11;
  ulong uVar12;
  size_t __new_size;
  ulong uVar13;
  uint uVar14;
  unsigned_short __old_val_1;
  ushort uVar15;
  uint uVar16;
  unsigned_short __old_val;
  ushort uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  pointer pSVar21;
  _Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
  *this;
  bool bVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_> V;
  byte local_61;
  pointer local_60;
  undefined1 local_58 [16];
  pointer local_48;
  ulong local_38;
  
  local_58 = (undefined1  [16])0x0;
  local_48 = (pointer)0x0;
  std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::reserve
            ((vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_> *)
             local_58,0x2000);
  if (input.len != 0) {
    lVar18 = 0;
    bVar22 = false;
    do {
      cVar2 = input.s[lVar18];
      if ((byte)(cVar2 - 0x30U) < 10) {
        local_61 = cVar2 - 0x30U;
        if (bVar22) {
          local_61 = 0x30 - cVar2;
        }
        std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::
        emplace_back<signed_char>
                  ((vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_> *)
                   local_58,(char *)&local_61);
        bVar22 = false;
      }
      else if (cVar2 == '-') {
        bVar22 = true;
      }
      lVar18 = lVar18 + 1;
    } while (input.len != lVar18);
  }
  uVar20 = local_58._8_8_ - local_58._0_8_;
  __new_size = uVar20 + 0x1f & 0xffffffffffffffe0;
  std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::resize
            ((vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_> *)
             local_58,__new_size);
  uVar19 = uVar20 >> 2;
  if ((uint16_t)uVar19 == 0) {
    pSVar7 = (pointer)0x0;
    local_60 = (pointer)0x0;
  }
  else {
    local_38 = uVar20;
    pSVar6 = std::
             _Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
             ::_M_allocate((_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                            *)(uVar19 & 0xffff),__new_size);
    pSVar21 = pSVar6 + (long)(uVar19 & 0xffff);
    uVar11 = 0;
    pSVar10 = pSVar6;
    do {
      if (pSVar6 == pSVar21) {
        lVar18 = (long)pSVar21 - (long)pSVar10;
        if (lVar18 == 0x7ffffffffffffffc) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar9 = lVar18 >> 2;
        uVar20 = uVar9;
        if (pSVar21 == pSVar10) {
          uVar20 = 1;
        }
        this = (_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                *)(uVar20 + uVar9);
        if ((_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
             *)0x1ffffffffffffffe < this) {
          this = (_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                  *)0x1fffffffffffffff;
        }
        if (CARRY8(uVar20,uVar9)) {
          this = (_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                  *)0x1fffffffffffffff;
        }
        pSVar7 = std::
                 _Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                 ::_M_allocate(this,__new_size);
        *(uint16_t *)((long)pSVar7 + lVar18) = uVar11;
        *(undefined2 *)((long)pSVar7 + lVar18 + 2) = 0;
        pSVar6 = pSVar7;
        for (pSVar8 = pSVar10; pSVar21 != pSVar8; pSVar8 = pSVar8 + 1) {
          *pSVar6 = *pSVar8;
          pSVar6 = pSVar6 + 1;
        }
        if (pSVar10 != (pointer)0x0) {
          __new_size = (long)pSVar21 - (long)pSVar10;
          operator_delete(pSVar10,__new_size);
        }
        pSVar21 = pSVar7 + (long)this;
      }
      else {
        pSVar6->parent = uVar11;
        pSVar6->rank = 0;
        pSVar7 = pSVar10;
      }
      pSVar6 = pSVar6 + 1;
      uVar11 = uVar11 + 1;
      pSVar10 = pSVar7;
      uVar20 = local_38;
      local_60 = pSVar21;
    } while (uVar11 != (uint16_t)uVar19);
  }
  if ((uVar20 & 0x3fffffff8) == 0) {
LAB_00113af0:
    printf("Day 25 Part 1: %u\n",uVar19 & 0xffff);
    if (pSVar7 != (pointer)0x0) {
      operator_delete(pSVar7,(long)local_60 - (long)pSVar7);
    }
    if ((pointer)local_58._0_8_ != (pointer)0x0) {
      free((void *)local_58._0_8_);
    }
    return;
  }
  auVar23._8_4_ = 0x1010101;
  auVar23._0_8_ = 0x101010101010101;
  auVar23._12_4_ = 0x1010101;
  auVar23._16_4_ = 0x1010101;
  auVar23._20_4_ = 0x1010101;
  auVar23._24_4_ = 0x1010101;
  auVar23._28_4_ = 0x1010101;
  auVar24._8_4_ = 0x3ffffff;
  auVar24._0_8_ = 0x3ffffff03ffffff;
  auVar24._12_4_ = 0x3ffffff;
  auVar24._16_4_ = 0x3ffffff;
  auVar24._20_4_ = 0x3ffffff;
  auVar24._24_4_ = 0x3ffffff;
  auVar24._28_4_ = 0x3ffffff;
  uVar9 = 1;
  uVar20 = uVar19 & 0xffffffff;
LAB_001139e6:
  uVar1 = *(undefined4 *)(local_58._0_8_ + uVar9 * 4);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar25._16_4_ = uVar1;
  auVar25._20_4_ = uVar1;
  auVar25._24_4_ = uVar1;
  auVar25._28_4_ = uVar1;
  uVar13 = 0;
  do {
    auVar4 = vpsubb_avx2(auVar25,*(undefined1 (*) [32])(local_58._0_8_ + uVar13 * 0x20));
    auVar4 = vpabsb_avx2(auVar4);
    auVar4 = vpmulld_avx2(auVar4,auVar23);
    auVar4 = vpcmpgtd_avx2(auVar4,auVar24);
    uVar14 = ((uint)(SUB321(auVar4 >> 7,0) & 1) | (uint)(SUB321(auVar4 >> 0xf,0) & 1) << 1 |
              (uint)(SUB321(auVar4 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar4 >> 0x1f,0) & 1) << 3
              | (uint)(SUB321(auVar4 >> 0x27,0) & 1) << 4 |
              (uint)(SUB321(auVar4 >> 0x2f,0) & 1) << 5 | (uint)(SUB321(auVar4 >> 0x37,0) & 1) << 6
              | (uint)(SUB321(auVar4 >> 0x3f,0) & 1) << 7 |
              (uint)(SUB321(auVar4 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar4 >> 0x4f,0) & 1) << 9
              | (uint)(SUB321(auVar4 >> 0x57,0) & 1) << 10 |
              (uint)(SUB321(auVar4 >> 0x5f,0) & 1) << 0xb |
              (uint)(SUB321(auVar4 >> 0x67,0) & 1) << 0xc |
              (uint)(SUB321(auVar4 >> 0x6f,0) & 1) << 0xd |
              (uint)(SUB321(auVar4 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar4 >> 0x7f,0) << 0xf |
              (uint)(SUB321(auVar4 >> 0x87,0) & 1) << 0x10 |
              (uint)(SUB321(auVar4 >> 0x8f,0) & 1) << 0x11 |
              (uint)(SUB321(auVar4 >> 0x97,0) & 1) << 0x12 |
              (uint)(SUB321(auVar4 >> 0x9f,0) & 1) << 0x13 |
              (uint)(SUB321(auVar4 >> 0xa7,0) & 1) << 0x14 |
              (uint)(SUB321(auVar4 >> 0xaf,0) & 1) << 0x15 |
              (uint)(SUB321(auVar4 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar4 >> 0xbf,0) << 0x17
              | (uint)(SUB321(auVar4 >> 199,0) & 1) << 0x18 |
              (uint)(SUB321(auVar4 >> 0xcf,0) & 1) << 0x19 |
              (uint)(SUB321(auVar4 >> 0xd7,0) & 1) << 0x1a |
              (uint)(SUB321(auVar4 >> 0xdf,0) & 1) << 0x1b |
              (uint)(SUB321(auVar4 >> 0xe7,0) & 1) << 0x1c |
              (uint)(SUB321(auVar4 >> 0xef,0) & 1) << 0x1d |
              (uint)(SUB321(auVar4 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar4[0x1f] >> 7) << 0x1f
             ) ^ 0xffffffff;
    if (uVar14 != 0) {
      uVar14 = uVar14 & 0x11111111;
      do {
        uVar16 = 0;
        for (uVar5 = uVar14; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x80000000) {
          uVar16 = uVar16 + 1;
        }
        uVar16 = (uVar16 >> 2) + (int)uVar13 * 8;
        uVar12 = (ulong)uVar16;
        if (uVar9 == uVar12) {
          uVar9 = uVar9 + 1;
          if (uVar9 == uVar20) goto LAB_00113af0;
          goto LAB_001139e6;
        }
        uVar15 = pSVar7[uVar9 & 0xffff].parent;
        pSVar21 = pSVar7 + (uVar9 & 0xffff);
        uVar17 = (ushort)uVar9;
        if (uVar15 != (ushort)uVar9) {
          do {
            uVar17 = uVar15;
            uVar15 = pSVar7[uVar17].parent;
            pSVar21->parent = uVar15;
            pSVar21 = pSVar7 + uVar17;
          } while (uVar15 != uVar17);
        }
        uVar15 = (ushort)uVar16;
        if (pSVar7[uVar15].parent != uVar15) {
          pSVar21 = pSVar7 + uVar15;
          uVar15 = pSVar7[uVar15].parent;
          do {
            uVar12 = (ulong)uVar15;
            uVar3 = pSVar7[uVar12].parent;
            pSVar21->parent = uVar3;
            bVar22 = uVar3 != uVar15;
            pSVar21 = pSVar7 + uVar12;
            uVar15 = uVar3;
          } while (bVar22);
        }
        if (uVar17 != (uint16_t)uVar12) {
          uVar19 = (ulong)((int)uVar19 - 1);
          uVar15 = pSVar7[uVar17].rank;
          if (uVar15 < pSVar7[uVar12 & 0xffff].rank) {
            pSVar7[uVar17].parent = (uint16_t)uVar12;
          }
          else {
            pSVar7[uVar12 & 0xffff].parent = uVar17;
            if (uVar15 == pSVar7[uVar12 & 0xffff].rank) {
              pSVar7[uVar17].rank = uVar15 + 1;
            }
          }
        }
        uVar14 = uVar14 - 1 & uVar14;
      } while (uVar14 != 0);
    }
    uVar13 = (ulong)((int)uVar13 + 1);
  } while( true );
}

Assistant:

void day25(input_t input) {
	std::vector<int8_t, aligned_allocator<int8_t, alignof(__m256i)>> V;
	V.reserve(8192);

	for (uint8_t n = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 10) {
			V.push_back(n ? -c : c);
			n = 0;
		} else if (*input.s == '-') {
			n = 1;
		}
	}

	uint32_t n_points = V.size() / 4;

	// Pad to nearest multiple of AVX2 vector size
	V.resize((V.size() + 31ULL) & ~31ULL);
	uint32_t n_vectors = V.size() / 32;

	DisjointSet S(n_points);

	auto p32  = (uint32_t *) &V[0];
	auto p256 = (__m256i  *) &V[0];

	// Pairwise measure distance between points
	for (uint32_t i = 1; i < n_points; i++) {
		__m256i v = _mm256_set1_epi32(p32[i]);

		// Compare this point against 8 points at a time
		for (uint32_t j = 0; ; j++) {
			// Absolute difference per coordinate
			__m256i d = _mm256_abs_epi8(_mm256_sub_epi8(v, p256[j]));
			// Horizontal sum of differences per point
			d = _mm256_add_epi32(d, _mm256_slli_epi32(d, 16));
			d = _mm256_add_epi32(d, _mm256_slli_epi32(d,  8));
			// Less than 4?
			d = _mm256_cmpgt_epi32(_mm256_set1_epi32(0x04000000), d);

			uint32_t m = _mm256_movemask_epi8(d);
			if (m) {
				m &= 0x11111111;
				uint32_t base = j * 8;
				do {
					uint32_t idx = base + _tzcnt_u32(m) / 4;
					if (idx == i) {
						goto next_point;
					}
					S.join(i, idx);
					m = _blsr_u32(m);
				} while (m);
			}
		}
next_point:;
	}
	printf("Day 25 Part 1: %u\n", S.trees);
}